

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall
QTableViewPrivate::setSpan(QTableViewPrivate *this,int row,int column,int rowSpan,int columnSpan)

{
  uint uVar1;
  Span *pSVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  Span *in_stack_00000008;
  Span *in_stack_00000018;
  int old_height;
  Span *sp;
  char *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff64;
  undefined3 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff74;
  uint local_80;
  uint local_7c;
  char local_68 [16];
  QSpanCollection *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  QSpanCollection *in_stack_ffffffffffffffb8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(1,in_stack_ffffffffffffff70);
  if (((-1 < (int)in_ESI) && (uVar3 = CONCAT13(1,in_stack_ffffffffffffff70), -1 < (int)in_EDX)) &&
     (uVar3 = CONCAT13(1,in_stack_ffffffffffffff70), 0 < (int)in_ECX)) {
    uVar3 = CONCAT13((int)in_R8D < 1,in_stack_ffffffffffffff70);
  }
  if ((char)((uint)uVar3 >> 0x18) == '\0') {
    pSVar2 = QSpanCollection::spanAt
                       ((QSpanCollection *)CONCAT44(in_stack_ffffffffffffff74,uVar3),
                        (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    if (pSVar2 == (Span *)0x0) {
      uVar1 = in_stack_ffffffffffffff64 & 0xffffff;
      if (in_ECX == 1) {
        uVar1 = CONCAT13(in_R8D == 1,(int3)in_stack_ffffffffffffff64);
      }
      if ((char)(uVar1 >> 0x18) == '\0') {
        pSVar2 = (Span *)operator_new(0x14);
        QSpanCollection::Span::Span(pSVar2,in_ESI,in_EDX,in_ECX,in_R8D);
        QSpanCollection::addSpan(in_stack_ffffffffffffffa8,in_stack_00000018);
      }
      else {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,uVar3),in_RDI,uVar1,
                   in_stack_ffffffffffffff58);
        QMessageLogger::warning(local_68,"QTableView::setSpan: single cell span won\'t be added");
      }
    }
    else {
      uVar1 = QSpanCollection::Span::top(pSVar2);
      if (uVar1 == in_ESI) {
        uVar1 = QSpanCollection::Span::left(pSVar2);
        if (uVar1 == in_EDX) {
          local_80 = in_R8D;
          local_7c = in_ECX;
          if ((in_ECX == 1) && (in_R8D == 1)) {
            local_80 = 0;
            local_7c = 0;
          }
          QSpanCollection::Span::height(pSVar2);
          pSVar2->m_bottom = in_ESI + local_7c + -1;
          pSVar2->m_right = in_EDX + local_80 + -1;
          QSpanCollection::updateSpan
                    (in_stack_ffffffffffffffb8,in_stack_00000008,in_stack_ffffffffffffffb4);
          goto LAB_008b39fd;
        }
      }
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,uVar3),in_RDI,
                 in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
      QMessageLogger::warning(&stack0xffffffffffffffb8,"QTableView::setSpan: span cannot overlap");
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,uVar3),in_RDI,
               in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
    QMessageLogger::warning
              (local_28,"QTableView::setSpan: invalid span given: (%d, %d, %d, %d)",(ulong)in_ESI,
               (ulong)in_EDX,(ulong)in_ECX,(ulong)in_R8D);
  }
LAB_008b39fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::setSpan(int row, int column, int rowSpan, int columnSpan)
{
    if (Q_UNLIKELY(row < 0 || column < 0 || rowSpan <= 0 || columnSpan <= 0)) {
        qWarning("QTableView::setSpan: invalid span given: (%d, %d, %d, %d)",
                 row, column, rowSpan, columnSpan);
        return;
    }
    QSpanCollection::Span *sp = spans.spanAt(column, row);
    if (sp) {
        if (sp->top() != row || sp->left() != column) {
            qWarning("QTableView::setSpan: span cannot overlap");
            return;
        }
        if (rowSpan == 1 && columnSpan == 1) {
            rowSpan = columnSpan = 0;
        }
        const int old_height = sp->height();
        sp->m_bottom = row + rowSpan - 1;
        sp->m_right = column + columnSpan - 1;
        spans.updateSpan(sp, old_height);
        return;
    } else if (Q_UNLIKELY(rowSpan == 1 && columnSpan == 1)) {
        qWarning("QTableView::setSpan: single cell span won't be added");
        return;
    }
    sp = new QSpanCollection::Span(row, column, rowSpan, columnSpan);
    spans.addSpan(sp);
}